

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

int av1_add_film_grain(aom_film_grain_t *params,aom_image_t *src,aom_image_t *dst)

{
  int *cb_grain;
  int *cr_grain;
  aom_img_fmt_t aVar1;
  aom_matrix_coefficients_t aVar2;
  uint uVar3;
  uchar *puVar4;
  undefined4 *puVar5;
  bool bVar6;
  short sVar7;
  ushort uVar8;
  sbyte sVar9;
  aom_transfer_characteristics_t aVar10;
  aom_chroma_sample_position_t aVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint right_stride;
  int iVar15;
  int iVar16;
  int iVar17;
  void *memblk;
  void *pvVar18;
  void *pvVar19;
  ulong extraout_RAX;
  ulong uVar20;
  undefined8 *puVar21;
  byte bVar22;
  byte bVar24;
  byte bVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int *piVar29;
  long lVar30;
  ulong uVar31;
  size_t sVar32;
  bool bVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  int chroma_subsamp_y;
  uint uVar43;
  undefined4 uVar44;
  long lVar45;
  void *pvVar46;
  long lVar47;
  ulong uVar48;
  int i;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  sbyte sVar56;
  int j;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  uint16_t uVar61;
  uint uVar62;
  uint uVar63;
  int iVar64;
  uchar *puVar65;
  ulong __n;
  ulong uVar66;
  int *cr_grain_00;
  int *piVar67;
  uint uVar68;
  int iVar69;
  uchar *puVar70;
  ulong uVar71;
  uint uVar72;
  int iVar73;
  int iVar74;
  uint uVar75;
  size_t sVar76;
  int iVar77;
  int iVar78;
  bool bVar79;
  undefined1 auVar80 [16];
  int local_2a8;
  void *local_2a0;
  void *local_298;
  ulong local_288;
  void *local_250;
  void *local_230;
  int *local_208;
  void *local_1f8;
  void *local_1f0;
  int *local_1e8;
  int *local_1e0;
  byte bVar23;
  
  aVar1 = src->fmt;
  aVar2 = src->mc;
  if ((int)aVar1 < 0x902) {
    iVar77 = 1;
    bVar6 = true;
    switch(aVar1) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_AOMI420:
      sVar56 = 0;
      sVar9 = 0;
      goto LAB_0017c0eb;
    default:
switchD_0017c0a3_caseD_103:
      av1_add_film_grain_cold_2();
      goto LAB_0017e30b;
    case AOM_IMG_FMT_I422:
      sVar56 = 0;
      sVar9 = 0;
      break;
    case AOM_IMG_FMT_I444:
      sVar56 = 0;
      sVar9 = 0;
LAB_0017c140:
      iVar77 = 0;
    }
LAB_0017c143:
    chroma_subsamp_y = 0;
  }
  else {
    if (aVar1 == AOM_IMG_FMT_I44416) {
      bVar6 = false;
      sVar9 = 1;
      sVar56 = 1;
      goto LAB_0017c140;
    }
    if (aVar1 == AOM_IMG_FMT_I42216) {
      bVar6 = false;
      sVar9 = 1;
      sVar56 = 1;
      iVar77 = 1;
      goto LAB_0017c143;
    }
    if (aVar1 != AOM_IMG_FMT_I42016) goto switchD_0017c0a3_caseD_103;
    sVar9 = 1;
    sVar56 = 1;
    bVar6 = false;
LAB_0017c0eb:
    iVar77 = 1;
    chroma_subsamp_y = 1;
  }
  dst->fmt = aVar1;
  dst->r_h = src->r_h;
  uVar72 = src->d_w;
  uVar43 = src->d_h;
  uVar68 = src->r_w;
  uVar3 = src->d_w;
  uVar38 = src->d_h;
  dst->bit_depth = src->bit_depth;
  dst->d_w = uVar72;
  dst->d_h = uVar43;
  dst->r_w = uVar68;
  aVar10 = src->tc;
  dst->cp = src->cp;
  dst->tc = aVar10;
  dst->mc = aVar2;
  aVar11 = src->csp;
  dst->monochrome = src->monochrome;
  dst->csp = aVar11;
  dst->range = src->range;
  uVar72 = src->y_chroma_shift;
  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = uVar72;
  iVar34 = src->spatial_id;
  dst->temporal_id = src->temporal_id;
  dst->spatial_id = iVar34;
  if (uVar38 == 0) {
    uVar72 = 0;
    uVar43 = uVar3;
    uVar68 = uVar3 & 1;
  }
  else {
    iVar34 = dst->stride[0];
    puVar70 = dst->planes[0];
    iVar73 = src->stride[0];
    puVar65 = src->planes[0];
    uVar72 = uVar38;
    do {
      memcpy(puVar70,puVar65,(long)(int)uVar3 << sVar56);
      puVar65 = puVar65 + iVar73;
      puVar70 = puVar70 + iVar34;
      uVar72 = uVar72 - 1;
    } while (uVar72 != 0);
    uVar72 = src->d_h;
    uVar43 = src->d_w;
    uVar68 = src->d_w & 1;
  }
  if (((uVar72 | uVar43) & 1) != 0) {
    puVar70 = dst->planes[0];
    iVar34 = dst->stride[0];
    if (bVar6) {
      if (0 < (int)uVar72 && uVar68 != 0) {
        uVar50 = (ulong)uVar72;
        puVar65 = puVar70 + (int)uVar43;
        do {
          *puVar65 = puVar65[-1];
          puVar65 = puVar65 + iVar34;
          uVar50 = uVar50 - 1;
        } while (uVar50 != 0);
      }
      if ((uVar72 & 1) != 0) {
        lVar47 = (long)(int)(uVar72 * iVar34);
        lVar45 = (long)(int)((uVar72 - 1) * iVar34);
        sVar32 = (size_t)(int)(uVar43 + 1 & 0xfffffffe);
LAB_0017c30a:
        memcpy(puVar70 + lVar47,puVar70 + lVar45,sVar32);
      }
    }
    else {
      iVar34 = iVar34 / 2;
      if (0 < (int)uVar72 && uVar68 != 0) {
        uVar50 = (ulong)uVar72;
        puVar65 = puVar70 + (long)(int)uVar43 * 2;
        do {
          *(undefined2 *)puVar65 = *(undefined2 *)(puVar65 + -2);
          puVar65 = puVar65 + (long)iVar34 * 2;
          uVar50 = uVar50 - 1;
        } while (uVar50 != 0);
      }
      if ((uVar72 & 1) != 0) {
        lVar47 = (long)(int)(uVar72 * iVar34) * 2;
        lVar45 = (long)(int)((uVar72 - 1) * iVar34) * 2;
        sVar32 = (long)(int)(uVar43 + 1 & 0xfffffffe) * 2;
        goto LAB_0017c30a;
      }
    }
  }
  iVar34 = (uVar3 & 1) + uVar3;
  uVar38 = (uVar38 & 1) + uVar38;
  bVar22 = (byte)chroma_subsamp_y;
  bVar23 = (byte)iVar77;
  if ((src->monochrome == 0) && (iVar73 = (int)uVar38 >> bVar22, iVar73 != 0)) {
    iVar12 = dst->stride[1];
    puVar70 = dst->planes[1];
    iVar13 = src->stride[1];
    puVar65 = src->planes[1];
    sVar32 = (long)(iVar34 >> bVar23) << sVar56;
    iVar35 = iVar73;
    do {
      memcpy(puVar70,puVar65,sVar32);
      puVar65 = puVar65 + iVar13;
      puVar70 = puVar70 + iVar12;
      iVar35 = iVar35 + -1;
    } while (iVar35 != 0);
    iVar12 = dst->stride[2];
    puVar70 = dst->planes[2];
    iVar13 = src->stride[2];
    puVar65 = src->planes[2];
    do {
      memcpy(puVar70,puVar65,sVar32);
      puVar65 = puVar65 + iVar13;
      puVar70 = puVar70 + iVar12;
      iVar73 = iVar73 + -1;
    } while (iVar73 != 0);
  }
  puVar70 = dst->planes[0];
  iVar12 = dst->stride[0] >> sVar9;
  puVar65 = dst->planes[1];
  puVar4 = dst->planes[2];
  iVar13 = dst->stride[1] >> sVar9;
  random_register = params->random_seed;
  uVar72 = 0x20 >> bVar23;
  uVar43 = 2 >> bVar22;
  uVar50 = (ulong)uVar43;
  uVar68 = 2 >> bVar23;
  iVar73 = params->overlap_flag;
  uVar3 = params->bit_depth;
  iVar35 = 0x80 << ((char)uVar3 - 8U & 0x1f);
  grain_min = -iVar35;
  grain_max = iVar35 + -1;
  chroma_subblock_size_y = 0x20U >> bVar22;
  chroma_subblock_size_x = uVar72;
  memset(scaling_lut_y,0,0x400);
  memset(scaling_lut_cb,0,0x400);
  memset(scaling_lut_cr,0,0x400);
  sVar76 = ((long)params->ar_coeff_lag + 1) * (long)params->ar_coeff_lag * 2;
  bVar79 = 0 < params->num_y_points;
  memblk = aom_calloc(sVar76,8);
  if (memblk == (void *)0x0) {
LAB_0017e30b:
    local_2a8 = -1;
  }
  else {
    iVar35 = (int)sVar76;
    if (0 < iVar35) {
      uVar71 = 0;
      do {
        pvVar18 = aom_malloc(0xc);
        *(void **)((long)memblk + uVar71 * 8) = pvVar18;
        if (pvVar18 == (void *)0x0) {
          local_2a8 = -1;
          memblk = (void *)0x0;
          local_2a0 = (void *)0x0;
          local_298 = (void *)0x0;
          local_250 = (void *)0x0;
          local_230 = (void *)0x0;
          local_1f0 = (void *)0x0;
          local_1f8 = (void *)0x0;
          local_208 = (int *)0x0;
          local_1e0 = (int *)0x0;
          local_1e8 = (int *)0x0;
          pvVar18 = (void *)0x0;
          goto LAB_0017c9f0;
        }
        uVar71 = uVar71 + 1;
      } while ((sVar76 & 0xffffffff) != uVar71);
    }
    iVar39 = iVar35 + (uint)bVar79;
    pvVar46 = (void *)0x8;
    pvVar18 = aom_calloc((long)iVar39,8);
    local_2a8 = -1;
    if (pvVar18 == (void *)0x0) {
      memblk = (void *)0x0;
      pvVar18 = (void *)0x0;
      local_2a0 = (void *)0x0;
      local_298 = (void *)0x0;
      local_250 = (void *)0x0;
      local_230 = (void *)0x0;
      local_1f0 = (void *)0x0;
      local_1f8 = (void *)0x0;
      local_208 = (int *)0x0;
      local_1e0 = (int *)0x0;
      local_1e8 = (int *)0x0;
    }
    else {
      if (0 < iVar39) {
        local_2a0 = (void *)0x0;
        uVar71 = 0;
        do {
          pvVar19 = aom_malloc(0xc);
          *(void **)((long)pvVar18 + uVar71 * 8) = pvVar19;
          if (pvVar19 == (void *)0x0) {
            memblk = (void *)0x0;
            pvVar18 = (void *)0x0;
            local_298 = (void *)0x0;
            local_250 = (void *)0x0;
            local_230 = (void *)0x0;
            local_1f0 = (void *)0x0;
            local_1f8 = (void *)0x0;
            local_208 = (int *)0x0;
            local_1e0 = (int *)0x0;
            local_1e8 = (int *)0x0;
            goto LAB_0017c9f0;
          }
          uVar71 = uVar71 + 1;
        } while (iVar35 + (uint)bVar79 != uVar71);
      }
      iVar39 = uVar68 * 3 + 3;
      iVar74 = uVar68 * 3 + uVar72 * 2;
      iVar35 = params->ar_coeff_lag;
      if (iVar35 < 1) {
        iVar26 = 0;
      }
      else {
        pvVar46 = (void *)(ulong)(uint)-iVar35;
        lVar47 = 0;
        do {
          iVar52 = (int)pvVar46;
          if (-1 < iVar35) {
            lVar47 = (long)(int)lVar47;
            iVar26 = -iVar35;
            do {
              piVar29 = *(int **)((long)memblk + lVar47 * 8);
              *piVar29 = iVar52;
              piVar29[1] = iVar26;
              piVar29[2] = 0;
              piVar29 = *(int **)((long)pvVar18 + lVar47 * 8);
              *piVar29 = iVar52;
              piVar29[1] = iVar26;
              piVar29[2] = 0;
              lVar47 = lVar47 + 1;
              iVar35 = params->ar_coeff_lag;
              bVar79 = iVar26 < iVar35;
              iVar26 = iVar26 + 1;
            } while (bVar79);
          }
          iVar26 = (int)lVar47;
          pvVar46 = (void *)(ulong)(iVar52 + 1U);
        } while (iVar52 + 1U != 0);
        if (0 < iVar35) {
          pvVar46 = (void *)((long)pvVar18 + (long)iVar26 * 8);
          lVar47 = 0;
          do {
            iVar52 = (int)lVar47 - iVar35;
            puVar5 = *(undefined4 **)((long)memblk + lVar47 * 8 + (long)iVar26 * 8);
            *puVar5 = 0;
            puVar5[1] = iVar52;
            puVar5[2] = 0;
            puVar5 = *(undefined4 **)((long)pvVar46 + lVar47 * 8);
            *puVar5 = 0;
            puVar5[1] = iVar52;
            puVar5[2] = 0;
            lVar47 = lVar47 + 1;
          } while ((int)lVar47 != iVar35);
          iVar26 = iVar26 + (int)lVar47;
        }
      }
      uVar44 = SUB84(pvVar46,0);
      uVar14 = uVar43 * 3 + (0x20U >> bVar22) * 2 + 3;
      right_stride = iVar39 + iVar74 + 3;
      uVar71 = (ulong)right_stride;
      if (0 < params->num_y_points) {
        puVar21 = *(undefined8 **)((long)pvVar18 + (long)iVar26 * 8);
        *puVar21 = 0;
        *(undefined4 *)(puVar21 + 1) = 1;
      }
      lVar47 = (long)iVar12;
      local_230 = aom_malloc(lVar47 * 8);
      sVar76 = uVar50 * (long)iVar13 * 4;
      local_1f0 = aom_malloc(sVar76);
      local_1f8 = aom_malloc(sVar76);
      local_208 = (int *)aom_malloc(0x110);
      __n = (ulong)(uVar68 * 4);
      local_1e0 = (int *)aom_malloc((chroma_subblock_size_y + uVar43) * __n);
      local_1e8 = (int *)aom_malloc((chroma_subblock_size_y + uVar43) * __n);
      local_2a0 = aom_malloc(0x5d88);
      uVar48 = (ulong)(uVar14 * right_stride * 4);
      local_298 = aom_malloc(uVar48);
      local_250 = aom_malloc(uVar48);
      auVar80._0_4_ = -(uint)((int)((ulong)local_230 >> 0x20) == 0 && (int)local_230 == 0);
      auVar80._4_4_ = -(uint)((int)local_1f0 == 0 && (int)((ulong)local_1f0 >> 0x20) == 0);
      auVar80._8_4_ = -(uint)((int)((ulong)local_1f8 >> 0x20) == 0 && (int)local_1f8 == 0);
      auVar80._12_4_ = -(uint)((int)local_208 == 0 && (int)((ulong)local_208 >> 0x20) == 0);
      iVar35 = movmskps(uVar44,auVar80);
      if ((((local_1e8 != (int *)0x0 && local_1e0 != (int *)0x0) && local_2a0 != (void *)0x0) &&
           iVar35 == 0) && (local_250 != (void *)0x0 && local_298 != (void *)0x0)) {
        if (params->num_y_points == 0) {
          memset(local_2a0,0,0x5d88);
        }
        else {
          bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
          iVar35 = params->ar_coeff_lag;
          iVar26 = params->ar_coeff_shift;
          uVar62 = (uint)random_register;
          lVar45 = 0;
          pvVar46 = local_2a0;
          do {
            lVar58 = 0;
            do {
              uVar62 = uVar62 & 0xffff;
              uVar62 = (uVar62 ^ uVar62 >> 1 ^ uVar62 >> 0xc ^ uVar62 >> 3) << 0xf | uVar62 >> 1;
              *(int *)((long)pvVar46 + lVar58 * 4) =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar62 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              iVar15 = grain_max;
              iVar52 = grain_min;
              lVar58 = lVar58 + 1;
            } while (lVar58 != 0x52);
            lVar45 = lVar45 + 1;
            pvVar46 = (void *)((long)pvVar46 + 0x148);
          } while (lVar45 != 0x49);
          uVar53 = (iVar35 + 1) * iVar35 * 2;
          random_register = (uint16_t)uVar62;
          lVar45 = 3;
          do {
            lVar58 = 3;
            do {
              if ((int)uVar53 < 1) {
                iVar35 = 0;
              }
              else {
                uVar28 = 0;
                iVar35 = 0;
                do {
                  piVar29 = *(int **)((long)memblk + uVar28 * 8);
                  iVar35 = iVar35 + *(int *)((long)local_2a0 +
                                            (long)(piVar29[1] + (int)lVar58 +
                                                  (*piVar29 + (int)lVar45) * 0x52) * 4) *
                                    params->ar_coeffs_y[uVar28];
                  uVar28 = uVar28 + 1;
                } while (uVar53 != uVar28);
              }
              iVar57 = (iVar35 + (1 << ((char)iVar26 - 1U & 0x1f)) >>
                       ((byte)params->ar_coeff_shift & 0x1f)) +
                       *(int *)((long)local_2a0 + lVar58 * 4 + lVar45 * 0x148);
              iVar35 = iVar15;
              if (iVar57 < iVar15) {
                iVar35 = iVar57;
              }
              if (iVar57 < iVar52) {
                iVar35 = iVar52;
              }
              *(int *)((long)local_2a0 + lVar58 * 4 + lVar45 * 0x148) = iVar35;
              lVar58 = lVar58 + 1;
            } while (lVar58 != 0x4f);
            lVar45 = lVar45 + 1;
          } while (lVar45 != 0x49);
        }
        bVar24 = ((char)params->grain_scale_shift - (char)params->bit_depth) + 0xc;
        iVar35 = params->ar_coeff_lag;
        iVar26 = params->num_y_points;
        iVar52 = 1 << ((char)params->ar_coeff_shift - 1U & 0x1f);
        uVar28 = (ulong)uVar14;
        if ((params->num_cb_points == 0) && (params->chroma_scaling_from_luma == 0)) {
          memset(local_298,0,uVar48);
        }
        else {
          uVar14 = *(uint *)&params->random_seed ^ 0xb524;
          uVar66 = 0;
          pvVar46 = local_298;
          do {
            uVar55 = 0;
            do {
              uVar14 = uVar14 & 0xffff;
              uVar14 = (uVar14 ^ uVar14 >> 1 ^ uVar14 >> 0xc ^ uVar14 >> 3) << 0xf | uVar14 >> 1;
              *(int *)((long)pvVar46 + uVar55 * 4) =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar14 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              uVar55 = uVar55 + 1;
            } while (uVar71 != uVar55);
            uVar66 = uVar66 + 1;
            pvVar46 = (void *)((long)pvVar46 + (ulong)(right_stride * 4));
          } while (uVar66 != uVar28);
          random_register = (uint16_t)uVar14;
        }
        uVar14 = (uint)(0 < iVar26) + (iVar35 + 1) * iVar35 * 2;
        if ((params->num_cr_points == 0) && (params->chroma_scaling_from_luma == 0)) {
          memset(local_250,0,uVar48);
        }
        else {
          uVar62 = *(uint *)&params->random_seed ^ 0x49d8;
          uVar48 = 0;
          pvVar46 = local_250;
          do {
            uVar66 = 0;
            do {
              uVar62 = uVar62 & 0xffff;
              uVar62 = (uVar62 ^ uVar62 >> 1 ^ uVar62 >> 0xc ^ uVar62 >> 3) << 0xf | uVar62 >> 1;
              *(int *)((long)pvVar46 + uVar66 * 4) =
                   *(int *)((long)gaussian_sequence + (ulong)(uVar62 >> 3 & 0x1ffc)) +
                   ((1 << (bVar24 & 0x1f)) >> 1) >> (bVar24 & 0x1f);
              uVar66 = uVar66 + 1;
            } while (uVar71 != uVar66);
            uVar48 = uVar48 + 1;
            pvVar46 = (void *)((long)pvVar46 + (ulong)(right_stride * 4));
          } while (uVar48 != uVar28);
          random_register = (uint16_t)uVar62;
        }
        iVar26 = grain_max;
        iVar35 = grain_min;
        uVar48 = 3;
        do {
          iVar15 = (int)uVar48 + -3 << bVar22;
          lVar45 = uVar48 * uVar71;
          lVar58 = (long)(iVar15 + 3);
          uVar66 = 3;
          do {
            if ((int)uVar14 < 1) {
              iVar57 = 0;
              iVar69 = 0;
            }
            else {
              iVar16 = (int)uVar66 + -3 << bVar23;
              lVar59 = (long)(iVar16 + 3) + -1;
              uVar55 = 0;
              iVar69 = 0;
              iVar57 = 0;
              do {
                piVar29 = *(int **)((long)pvVar18 + uVar55 * 8);
                if (piVar29[2] == 0) {
                  lVar51 = (long)(int)(piVar29[1] + (int)uVar66 +
                                      (*piVar29 + (int)uVar48) * right_stride);
                  iVar27 = *(int *)((long)local_298 + lVar51 * 4) * params->ar_coeffs_cb[uVar55];
                  iVar78 = params->ar_coeffs_cr[uVar55];
                  piVar29 = (int *)((long)local_250 + lVar51 * 4);
                }
                else {
                  if (piVar29[2] != 1) {
                    av1_add_film_grain_cold_1();
                    if ((extraout_RAX & 1) == 0) {
                      return -1;
                    }
                    goto LAB_0017d116;
                  }
                  iVar78 = 0;
                  lVar51 = lVar59;
                  lVar37 = lVar58;
                  pvVar46 = (void *)(lVar58 * 0x148 + (long)local_2a0);
                  do {
                    do {
                      iVar78 = iVar78 + *(int *)((long)pvVar46 + lVar51 * 4 + 4);
                      lVar51 = lVar51 + 1;
                    } while (lVar51 < iVar77 + iVar16 + 3);
                    pvVar46 = (void *)((long)pvVar46 + 0x148);
                    bVar79 = lVar37 < iVar15 + chroma_subsamp_y + 3;
                    lVar51 = lVar59;
                    lVar37 = lVar37 + 1;
                  } while (bVar79);
                  iVar78 = (int)(iVar78 + ((uint)(1 << bVar23 + bVar22) >> 1)) >> bVar23 + bVar22;
                  iVar27 = params->ar_coeffs_cb[uVar55] * iVar78;
                  piVar29 = params->ar_coeffs_cr + uVar55;
                }
                iVar57 = iVar57 + iVar27;
                iVar69 = iVar69 + iVar78 * *piVar29;
                uVar55 = uVar55 + 1;
              } while (uVar55 != uVar14);
            }
            if ((params->num_cb_points != 0) || (params->chroma_scaling_from_luma != 0)) {
              iVar16 = (iVar57 + iVar52 >> ((byte)params->ar_coeff_shift & 0x1f)) +
                       *(int *)((long)local_298 + uVar66 * 4 + lVar45 * 4);
              iVar57 = iVar26;
              if (iVar16 < iVar26) {
                iVar57 = iVar16;
              }
              if (iVar16 < iVar35) {
                iVar57 = iVar35;
              }
              *(int *)((long)local_298 + uVar66 * 4 + lVar45 * 4) = iVar57;
            }
            if ((params->num_cr_points != 0) || (params->chroma_scaling_from_luma != 0)) {
              iVar69 = (iVar69 + iVar52 >> ((byte)params->ar_coeff_shift & 0x1f)) +
                       *(int *)((long)local_250 + uVar66 * 4 + lVar45 * 4);
              iVar57 = iVar26;
              if (iVar69 < iVar26) {
                iVar57 = iVar69;
              }
              if (iVar69 < iVar35) {
                iVar57 = iVar35;
              }
              *(int *)((long)local_250 + uVar66 * 4 + lVar45 * 4) = iVar57;
            }
            uVar66 = uVar66 + 1;
          } while (uVar66 != (uint)(iVar74 + iVar39));
          uVar48 = uVar48 + 1;
        } while (uVar48 != uVar28);
LAB_0017d116:
        init_scaling_function(params->scaling_points_y,params->num_y_points,scaling_lut_y);
        if (params->chroma_scaling_from_luma == 0) {
          init_scaling_function(params->scaling_points_cb,params->num_cb_points,scaling_lut_cb);
          init_scaling_function(params->scaling_points_cr,params->num_cr_points,scaling_lut_cr);
        }
        else {
          memcpy(scaling_lut_cb,scaling_lut_y,0x400);
          memcpy(scaling_lut_cr,scaling_lut_y,0x400);
        }
        if (1 < (int)uVar38) {
          iVar52 = iVar34 / 2;
          iVar35 = iVar12 * 2;
          bVar24 = bVar22 ^ 1;
          bVar25 = bVar23 ^ 1;
          iVar26 = 2 - iVar77;
          lVar45 = (long)iVar13 * 4;
          iVar74 = uVar72 * 2 + 6 + uVar68 * 6;
          uVar71 = (ulong)((uVar72 * 2 + uVar68 * 6) * 4 + 0x18);
          uVar48 = 0;
          uVar72 = uVar38;
          do {
            uVar14 = uVar72;
            if (0x21 < (int)uVar72) {
              uVar14 = 0x22;
            }
            sVar7 = (short)(uVar48 >> 4);
            random_register =
                 (sVar7 * 0xad + 0x69U & 0xff) + sVar7 * 0x2500 + 0xb200 ^ params->random_seed;
            if (1 < iVar34) {
              uVar28 = uVar48 * 2;
              iVar57 = uVar38 - (int)uVar28;
              iVar15 = 0x22;
              if (iVar57 < 0x22) {
                iVar15 = iVar57;
              }
              iVar57 = iVar57 >> bVar22;
              bVar79 = uVar48 != 0;
              iVar69 = 0;
              if (bVar79) {
                iVar69 = 2 - chroma_subsamp_y;
              }
              uVar53 = (uint)uVar48;
              uVar62 = bVar79 | uVar53;
              lVar59 = (long)(int)(uVar62 * iVar35);
              lVar58 = (long)(int)((uVar62 << bVar24) * iVar13);
              uVar66 = (ulong)(uint)(iVar69 * iVar26 * 4);
              piVar29 = (int *)((long)local_1e0 + uVar66);
              cr_grain_00 = (int *)(uVar66 + (long)local_1e8);
              iVar69 = (uVar38 >> 1) - uVar53;
              if (0xf < iVar69) {
                iVar69 = 0x10;
              }
              iVar16 = iVar69 - (uint)bVar79;
              bVar33 = bVar79 && iVar73 != 0;
              lVar51 = (long)(int)((uVar53 << bVar24) * iVar13);
              lVar37 = 0;
              do {
                uVar8 = random_register >> 1;
                iVar78 = (uint)(ushort)(random_register ^ uVar8 ^
                                       random_register >> 0xc ^ random_register >> 3) * 0x8000;
                uVar62 = iVar78 + (uint)uVar8;
                uVar61 = (uint16_t)uVar62;
                uVar63 = uVar62 >> 0xc & 0xf;
                uVar40 = random_register >> 9 & 0xf;
                iVar27 = uVar40 * 2 + 9;
                uVar62 = uVar63 * 2 + 9;
                iVar41 = uVar40 * uVar43 + uVar43 * 3 + 3;
                iVar64 = uVar63 * uVar68 + iVar39;
                uVar63 = (uint)(lVar37 != 0 && iVar73 != 0);
                uVar66 = (ulong)uVar63;
                uVar54 = (uint)lVar37;
                uVar42 = (uint)(aVar2 == AOM_CICP_MC_IDENTITY);
                random_register = uVar61;
                if (lVar37 != 0 && iVar73 != 0) {
                  ver_boundary_overlap
                            (local_208,2,
                             (int *)((long)local_2a0 +
                                    (ulong)uVar62 * 4 + (ulong)(uint)(iVar27 * 0x148)),0x52,
                             local_208,2,2,iVar15);
                  uVar55 = (ulong)(iVar41 * right_stride * 4);
                  iVar17 = chroma_subblock_size_y + uVar43;
                  if (iVar57 <= (int)(chroma_subblock_size_y + uVar43)) {
                    iVar17 = iVar57;
                  }
                  ver_boundary_overlap
                            (local_1e0,uVar68,(int *)((long)local_298 + (uint)(iVar64 * 4) + uVar55)
                             ,right_stride,local_1e0,uVar68,uVar68,iVar17);
                  iVar17 = chroma_subblock_size_y + uVar43;
                  if (iVar57 <= (int)(chroma_subblock_size_y + uVar43)) {
                    iVar17 = iVar57;
                  }
                  ver_boundary_overlap
                            (local_1e8,uVar68,(int *)((long)local_250 + (uint)(iVar64 * 4) + uVar55)
                             ,right_stride,local_1e8,uVar68,uVar68,iVar17);
                  lVar30 = (long)(int)(uVar54 << bVar25);
                  if (bVar6) {
                    add_noise_to_block(params,puVar70 + lVar37 * 2 + lVar59,
                                       puVar65 + lVar30 + lVar58,puVar4 + lVar30 + lVar58,iVar12,
                                       iVar13,local_208 + (ulong)bVar79 * 4,piVar29,cr_grain_00,2,
                                       iVar26,iVar16,1,uVar3,chroma_subsamp_y,iVar77,uVar42);
                    if (uVar48 == 0) {
                      iVar17 = 0;
                      uVar63 = 1;
                      uVar75 = 0;
                      goto LAB_0017dbc2;
                    }
LAB_0017d82b:
                    piVar67 = (int *)((long)local_230 + lVar37 * 8);
                    hor_boundary_overlap(piVar67,iVar12,local_208,2,piVar67,iVar12,2,2);
                    piVar67 = (int *)((long)local_1f0 + lVar37 * (ulong)uVar68 * 4);
                    hor_boundary_overlap
                              (piVar67,iVar13,local_1e0,uVar68,piVar67,iVar13,uVar68,uVar43);
                    piVar67 = (int *)((long)local_1f8 + lVar37 * (ulong)uVar68 * 4);
                    hor_boundary_overlap
                              (piVar67,iVar13,local_1e8,uVar68,piVar67,iVar13,uVar68,uVar43);
                    lVar30 = 2;
                    iVar17 = 0x1e;
LAB_0017d8e8:
                    uVar49 = uVar54 | 1;
                    if (lVar37 == 0) {
                      uVar49 = 0;
                    }
                    piVar67 = (int *)((long)local_230 + (long)(int)(uVar49 * 2) * 4);
                    iVar36 = iVar34 + uVar49 * -2;
                    if (iVar36 <= iVar17) {
                      iVar17 = iVar36;
                    }
                    hor_boundary_overlap
                              (piVar67,iVar12,
                               (int *)((long)local_2a0 +
                                      lVar30 * 4 + (ulong)uVar62 * 4 + (ulong)(uint)(iVar27 * 0x148)
                                      ),0x52,piVar67,iVar12,iVar17,2);
                    piVar67 = (int *)((long)local_1f0 + (long)(int)(uVar49 << bVar25) * 4);
                    uVar55 = (ulong)(iVar41 * right_stride * 4);
                    uVar75 = (uint)(lVar37 != 0) << bVar25;
                    iVar36 = iVar36 >> bVar23;
                    iVar17 = chroma_subblock_size_x - uVar75;
                    if (iVar36 <= (int)(chroma_subblock_size_x - uVar75)) {
                      iVar17 = iVar36;
                    }
                    hor_boundary_overlap
                              (piVar67,iVar13,
                               (int *)((long)local_298 +
                                      (ulong)uVar75 * 4 + (uint)(iVar64 * 4) + uVar55),right_stride,
                               piVar67,iVar13,iVar17,uVar43);
                    piVar67 = (int *)((long)local_1f8 + (long)(int)(uVar49 << bVar25) * 4);
                    iVar17 = chroma_subblock_size_x - uVar75;
                    if (iVar36 <= (int)(chroma_subblock_size_x - uVar75)) {
                      iVar17 = iVar36;
                    }
                    hor_boundary_overlap
                              (piVar67,iVar13,
                               (int *)((long)local_250 +
                                      (ulong)uVar75 * 4 + (uint)(iVar64 * 4) + uVar55),right_stride,
                               piVar67,iVar13,iVar17,uVar43);
                    lVar30 = (long)(int)(uVar54 << bVar25);
                    piVar67 = (int *)((long)local_230 + lVar37 * 8);
                    cb_grain = (int *)((long)local_1f0 + lVar30 * 4);
                    cr_grain = (int *)((long)local_1f8 + lVar30 * 4);
                    iVar17 = iVar52 - uVar54;
                    if (0xf < (int)(iVar52 - uVar54)) {
                      iVar17 = 0x10;
                    }
                    if (bVar6) {
                      add_noise_to_block(params,puVar70 + lVar37 * 2 + uVar28 * lVar47,
                                         puVar65 + lVar30 + lVar51,puVar4 + lVar30 + lVar51,iVar12,
                                         iVar13,piVar67,cb_grain,cr_grain,iVar12,iVar13,1,iVar17,
                                         uVar3,chroma_subsamp_y,iVar77,uVar42);
                      uVar75 = 1;
                      iVar17 = 2;
                      goto LAB_0017dbc2;
                    }
                    add_noise_to_block_hbd
                              (params,(uint16_t *)(puVar70 + lVar37 * 4 + uVar28 * lVar47 * 2),
                               (uint16_t *)(puVar65 + lVar30 * 2 + lVar51 * 2),
                               (uint16_t *)(puVar4 + lVar30 * 2 + lVar51 * 2),iVar12,iVar13,piVar67,
                               cb_grain,cr_grain,iVar12,iVar13,1,iVar17,uVar3,chroma_subsamp_y,
                               iVar77,uVar42);
                    uVar49 = 1;
                    iVar36 = 2;
                  }
                  else {
                    add_noise_to_block_hbd
                              (params,(uint16_t *)(puVar70 + lVar37 * 4 + lVar59 * 2),
                               (uint16_t *)(puVar65 + lVar30 * 2 + lVar58 * 2),
                               (uint16_t *)(puVar4 + lVar30 * 2 + lVar58 * 2),iVar12,iVar13,
                               local_208 + (ulong)bVar79 * 4,piVar29,cr_grain_00,2,iVar26,iVar16,1,
                               uVar3,chroma_subsamp_y,iVar77,uVar42);
                    uVar49 = 1;
                    if (bVar33) goto LAB_0017d82b;
LAB_0017dd0e:
                    uVar63 = uVar49;
                    iVar17 = iVar52 - uVar54;
                    if (0xf < (int)(iVar52 - uVar54)) {
                      iVar17 = 0x10;
                    }
                    iVar36 = 0;
                    uVar49 = 0;
                  }
                  local_288 = (ulong)uVar62;
                  lVar30 = (long)(int)(((uVar49 | uVar53) << bVar24) * iVar13);
                  lVar60 = (long)(int)((uVar54 | uVar63) << bVar25);
                  uVar55 = (ulong)(((uVar49 << bVar24) + iVar41) * right_stride);
                  add_noise_to_block_hbd
                            (params,(uint16_t *)
                                    (puVar70 +
                                    (long)(int)((uVar54 | uVar63) * 2) * 2 +
                                    (long)(int)((uVar49 | uVar53) * iVar35) * 2),
                             (uint16_t *)(puVar65 + lVar60 * 2 + lVar30 * 2),
                             (uint16_t *)(puVar4 + lVar60 * 2 + lVar30 * 2),iVar12,iVar13,
                             (int *)((long)local_2a0 +
                                    uVar66 * 8 +
                                    local_288 * 4 + (ulong)(uint)((iVar36 + iVar27) * 0x148)),
                             (int *)((long)local_298 +
                                    (ulong)(uVar63 << bVar25) * 4 +
                                    (ulong)(uint)(iVar64 * 4) + uVar55 * 4),
                             (int *)((long)local_250 +
                                    (ulong)(uVar63 << bVar25) * 4 +
                                    (ulong)(uint)(iVar64 * 4) + uVar55 * 4),0x52,right_stride,
                             iVar69 - uVar49,iVar17 - uVar63,uVar3,chroma_subsamp_y,iVar77,uVar42);
                }
                else {
                  if (bVar33) {
                    if (lVar37 != 0) goto LAB_0017d82b;
                    iVar17 = 0x20;
                    lVar30 = 0;
                    goto LAB_0017d8e8;
                  }
                  iVar17 = 0;
                  uVar63 = 0;
                  uVar75 = 0;
                  uVar49 = 0;
                  if (!bVar6) goto LAB_0017dd0e;
LAB_0017dbc2:
                  local_288 = (ulong)uVar62;
                  lVar60 = (long)(int)(((uVar75 | uVar53) << bVar24) * iVar13);
                  lVar30 = (long)(int)((uVar63 | uVar54) << bVar25);
                  uVar55 = (ulong)(((uVar75 << bVar24) + iVar41) * right_stride);
                  iVar36 = iVar52 - uVar54;
                  if (0xf < iVar36) {
                    iVar36 = 0x10;
                  }
                  add_noise_to_block(params,puVar70 + (long)(int)((uVar75 | uVar53) * iVar35) +
                                                      (long)(int)((uVar63 | uVar54) * 2),
                                     puVar65 + lVar60 + lVar30,puVar4 + lVar60 + lVar30,iVar12,
                                     iVar13,(int *)((long)local_2a0 +
                                                   uVar66 * 8 +
                                                   local_288 * 4 +
                                                   (ulong)(uint)((iVar17 + iVar27) * 0x148)),
                                     (int *)((long)local_298 +
                                            (ulong)(uVar63 << bVar25) * 4 +
                                            (ulong)(uint)(iVar64 * 4) + uVar55 * 4),
                                     (int *)((long)local_250 +
                                            (ulong)(uVar63 << bVar25) * 4 +
                                            (ulong)(uint)(iVar64 * 4) + uVar55 * 4),0x52,
                                     right_stride,iVar69 - uVar75,iVar36 - uVar63,uVar3,
                                     chroma_subsamp_y,iVar77,uVar42);
                }
                if (iVar73 != 0) {
                  if (lVar37 == 0) {
                    uVar54 = 0;
                    iVar64 = 0;
                    uVar63 = 0;
                  }
                  else {
                    iVar64 = uVar54 * 2;
                    *(undefined8 *)((long)local_230 + lVar37 * 8) =
                         *(undefined8 *)(local_208 + 0x40);
                    *(undefined8 *)((long)local_230 + lVar47 * 4 + lVar37 * 8) =
                         *(undefined8 *)(local_208 + 0x42);
                    uVar63 = chroma_subblock_size_y << bVar25;
                    pvVar46 = (void *)((long)local_1f0 + (long)(int)(uVar54 << bVar25) * 4);
                    piVar67 = local_1e0 + uVar63;
                    uVar66 = uVar50;
                    do {
                      memcpy(pvVar46,piVar67,__n);
                      piVar67 = (int *)((long)piVar67 + __n);
                      pvVar46 = (void *)((long)pvVar46 + lVar45);
                      uVar42 = (int)uVar66 - 1;
                      uVar66 = (ulong)uVar42;
                    } while (uVar42 != 0);
                    pvVar46 = (void *)((long)local_1f8 + (long)(int)(uVar54 << bVar25) * 4);
                    piVar67 = local_1e8 + uVar63;
                    uVar66 = uVar50;
                    do {
                      memcpy(pvVar46,piVar67,__n);
                      piVar67 = (int *)((long)piVar67 + __n);
                      pvVar46 = (void *)((long)pvVar46 + lVar45);
                      uVar63 = (int)uVar66 - 1;
                      uVar66 = (ulong)uVar63;
                    } while (uVar63 != 0);
                    uVar54 = uVar54 | 1;
                    uVar63 = 2;
                  }
                  pvVar46 = (void *)((long)local_230 + (long)(int)(uVar54 * 2) * 4);
                  iVar64 = iVar34 - iVar64;
                  iVar17 = 0x20;
                  if (iVar64 < 0x20) {
                    iVar17 = iVar64;
                  }
                  uVar42 = (uint)uVar8 + iVar78;
                  lVar30 = 0;
                  do {
                    memcpy(pvVar46,(void *)((long)local_2a0 +
                                           lVar30 + (ulong)(uVar42 >> 9 & 0x78) +
                                                    (ulong)uVar40 * 0x290 + (ulong)uVar63 * 4 +
                                                    0x34ac),(long)(int)(iVar17 - uVar63) << 2);
                    iVar78 = chroma_subblock_size_y;
                    lVar30 = lVar30 + 0x148;
                    pvVar46 = (void *)((long)pvVar46 + lVar47 * 4);
                  } while ((int)lVar30 != 0x290);
                  uVar63 = 0;
                  if (lVar37 != 0) {
                    uVar63 = uVar68;
                  }
                  uVar66 = (ulong)(uint)chroma_subblock_size_x;
                  iVar17 = iVar64 >> bVar23;
                  if (chroma_subblock_size_x < iVar64 >> bVar23) {
                    iVar17 = chroma_subblock_size_x;
                  }
                  pvVar46 = (void *)((long)local_1f0 + (long)(int)(uVar54 << bVar25) * 4);
                  sVar32 = (long)(int)(iVar17 - uVar63) << 2;
                  uVar20 = (ulong)(uint)((iVar41 + chroma_subblock_size_y) * iVar74);
                  uVar31 = (ulong)(((uVar42 >> 0xc & 0xf) + 3) * uVar68);
                  pvVar19 = (void *)((long)local_298 +
                                    (ulong)(uVar63 << 2) + uVar20 * 4 + uVar31 * 4 + 0xc);
                  uVar55 = uVar50;
                  do {
                    memcpy(pvVar46,pvVar19,sVar32);
                    pvVar19 = (void *)((long)pvVar19 + uVar71);
                    pvVar46 = (void *)((long)pvVar46 + lVar45);
                    uVar40 = (int)uVar55 - 1;
                    uVar55 = (ulong)uVar40;
                  } while (uVar40 != 0);
                  pvVar46 = (void *)((long)local_1f8 + (long)(int)(uVar54 << bVar25) * 4);
                  pvVar19 = (void *)((long)local_250 +
                                    (ulong)(uVar63 << 2) + uVar20 * 4 + uVar31 * 4 + 0xc);
                  uVar55 = uVar50;
                  do {
                    memcpy(pvVar46,pvVar19,sVar32);
                    pvVar19 = (void *)((long)pvVar19 + uVar71);
                    pvVar46 = (void *)((long)pvVar46 + lVar45);
                    uVar63 = (int)uVar55 - 1;
                    uVar55 = (ulong)uVar63;
                  } while (uVar63 != 0);
                  if (uVar28 != uVar38) {
                    puVar21 = (undefined8 *)
                              ((long)local_2a0 +
                              (ulong)uVar62 * 4 + (ulong)(uint)(iVar27 * 0x148) + 0x80);
                    lVar30 = 0;
                    do {
                      *(undefined8 *)(local_208 + lVar30 * 2) = *puVar21;
                      puVar21 = puVar21 + 0x29;
                      lVar30 = lVar30 + 1;
                    } while (uVar14 != (uint)lVar30);
                  }
                  iVar27 = iVar78 + uVar43;
                  if (iVar57 <= (int)(iVar78 + uVar43)) {
                    iVar27 = iVar57;
                  }
                  if (iVar27 != 0) {
                    uVar55 = (ulong)(uint)(iVar41 * iVar74);
                    pvVar46 = (void *)((long)local_298 + uVar55 * 4 + uVar66 * 4 + uVar31 * 4 + 0xc)
                    ;
                    piVar67 = local_1e0;
                    iVar78 = iVar27;
                    do {
                      memcpy(piVar67,pvVar46,__n);
                      pvVar46 = (void *)((long)pvVar46 + uVar71);
                      piVar67 = (int *)((long)piVar67 + __n);
                      iVar78 = iVar78 + -1;
                    } while (iVar78 != 0);
                    pvVar46 = (void *)((long)local_250 + uVar66 * 4 + uVar55 * 4 + uVar31 * 4 + 0xc)
                    ;
                    piVar67 = local_1e8;
                    do {
                      memcpy(piVar67,pvVar46,__n);
                      pvVar46 = (void *)((long)pvVar46 + uVar71);
                      piVar67 = (int *)((long)piVar67 + __n);
                      iVar27 = iVar27 + -1;
                    } while (iVar27 != 0);
                  }
                }
                lVar37 = lVar37 + 0x10;
              } while (lVar37 < iVar52);
            }
            uVar48 = uVar48 + 0x10;
            uVar72 = uVar72 - 0x20;
          } while (uVar48 < uVar38 >> 1);
        }
        local_2a8 = 0;
      }
    }
LAB_0017c9f0:
    iVar77 = (params->ar_coeff_lag + 1) * params->ar_coeff_lag;
    uVar3 = iVar77 * 2;
    bVar6 = 0 < params->num_y_points;
    if (memblk != (void *)0x0) {
      if (0 < (int)uVar3) {
        uVar50 = 0;
        do {
          aom_free(*(void **)((long)memblk + uVar50 * 8));
          uVar50 = uVar50 + 1;
        } while (uVar3 != uVar50);
      }
      aom_free(memblk);
    }
    if (pvVar18 != (void *)0x0) {
      if (0 < (int)((uint)bVar6 + iVar77 * 2)) {
        uVar50 = 0;
        do {
          aom_free(*(void **)((long)pvVar18 + uVar50 * 8));
          uVar50 = uVar50 + 1;
        } while (uVar3 + bVar6 != uVar50);
      }
      aom_free(pvVar18);
    }
    aom_free(local_230);
    aom_free(local_1f0);
    aom_free(local_1f8);
    aom_free(local_208);
    aom_free(local_1e0);
    aom_free(local_1e8);
    aom_free(local_2a0);
    aom_free(local_298);
    aom_free(local_250);
  }
  return local_2a8;
}

Assistant:

int av1_add_film_grain(const aom_film_grain_t *params, const aom_image_t *src,
                       aom_image_t *dst) {
  uint8_t *luma, *cb, *cr;
  int height, width, luma_stride, chroma_stride;
  int use_high_bit_depth = 0;
  int chroma_subsamp_x = 0;
  int chroma_subsamp_y = 0;
  int mc_identity = src->mc == AOM_CICP_MC_IDENTITY ? 1 : 0;

  switch (src->fmt) {
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_I420:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
    case AOM_IMG_FMT_I42016:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
      //    case AOM_IMG_FMT_444A:
    case AOM_IMG_FMT_I444:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I44416:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I422:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I42216:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    default:  // unknown input format
      fprintf(stderr, "Film grain error: input format is not supported!");
      return -1;
  }

  assert(params->bit_depth == src->bit_depth);

  dst->fmt = src->fmt;
  dst->bit_depth = src->bit_depth;

  dst->r_w = src->r_w;
  dst->r_h = src->r_h;
  dst->d_w = src->d_w;
  dst->d_h = src->d_h;

  dst->cp = src->cp;
  dst->tc = src->tc;
  dst->mc = src->mc;

  dst->monochrome = src->monochrome;
  dst->csp = src->csp;
  dst->range = src->range;

  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = src->y_chroma_shift;

  dst->temporal_id = src->temporal_id;
  dst->spatial_id = src->spatial_id;

  width = src->d_w % 2 ? src->d_w + 1 : src->d_w;
  height = src->d_h % 2 ? src->d_h + 1 : src->d_h;

  copy_rect(src->planes[AOM_PLANE_Y], src->stride[AOM_PLANE_Y],
            dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
            src->d_h, use_high_bit_depth);
  // Note that dst is already assumed to be aligned to even.
  extend_even(dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
              src->d_h, use_high_bit_depth);

  if (!src->monochrome) {
    copy_rect(src->planes[AOM_PLANE_U], src->stride[AOM_PLANE_U],
              dst->planes[AOM_PLANE_U], dst->stride[AOM_PLANE_U],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);

    copy_rect(src->planes[AOM_PLANE_V], src->stride[AOM_PLANE_V],
              dst->planes[AOM_PLANE_V], dst->stride[AOM_PLANE_V],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);
  }

  luma = dst->planes[AOM_PLANE_Y];
  cb = dst->planes[AOM_PLANE_U];
  cr = dst->planes[AOM_PLANE_V];

  // luma and chroma strides in samples
  luma_stride = dst->stride[AOM_PLANE_Y] >> use_high_bit_depth;
  chroma_stride = dst->stride[AOM_PLANE_U] >> use_high_bit_depth;

  return add_film_grain_run(params, luma, cb, cr, height, width, luma_stride,
                            chroma_stride, use_high_bit_depth, chroma_subsamp_y,
                            chroma_subsamp_x, mc_identity);
}